

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void asl_06(void)

{
  except = '\0';
  temp2 = getbyte(pc);
  carry_f = RAM[temp2] & 0x80;
  result_f = RAM[temp2] * '\x02';
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void asl_06(void) {
    CLE;
    result_f = RAM[temp2 = getbyte(pc)];
    carry_f = result_f & 0x80;
    result_f <<= 1;
    RAM[temp2] = result_f;
    pc++;
}